

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::copyteximage2d_max_width_height
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  string local_50;
  
  iVar2 = NegativeTestContext::getInteger(ctx,0xd33);
  iVar3 = NegativeTestContext::getInteger(ctx,0x851c);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_TEXTURE_SIZE."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GL_TEXTURE_2D target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  iVar2 = iVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0xde1,0,0x1907,0,0,iVar2,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0xde1,0,0x1907,0,0,1,iVar2,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0xde1,0,0x1907,0,0,iVar2,iVar2,0)
  ;
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_POSITIVE_X target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  iVar3 = iVar3 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8515,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8515,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x8515,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8517,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8517,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x8517,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_POSITIVE_Z target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8519,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8519,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x8519,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8516,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8516,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x8516,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8518,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x8518,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x8518,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x851a,0,0x1907,0,0,1,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D(&ctx->super_CallLogWrapper,0x851a,0,0x1907,0,0,iVar3,1,0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&ctx->super_CallLogWrapper,0x851a,0,0x1907,0,0,iVar3,iVar3,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void copyteximage2d_max_width_height (NegativeTestContext& ctx)
{
	int maxTextureSize = ctx.getInteger(GL_MAX_TEXTURE_SIZE) + 1;
	int maxCubemapSize = ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE) + 1;

	ctx.beginSection("GL_INVALID_VALUE is generated if width or height is greater than GL_MAX_TEXTURE_SIZE.");

	ctx.beginSection("GL_TEXTURE_2D target");
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 0, 0, maxTextureSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 0, 0, 1, maxTextureSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 0, 0, maxTextureSize, maxTextureSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_X target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Y target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Z target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_X target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target");
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 0, 0, 1, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 0, 0, maxCubemapSize, 1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 0, 0, maxCubemapSize, maxCubemapSize, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.endSection();
}